

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C1540.cpp
# Opt level: O0

Cycles __thiscall
Commodore::C1540::MachineBase::perform_bus_operation
          (MachineBase *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  ssize_t sVar1;
  undefined6 in_register_00000012;
  Cycles local_38;
  Cycles local_30;
  uint8_t *local_28;
  uint8_t *value_local;
  uint16_t address_local;
  MachineBase *pMStack_18;
  BusOperation operation_local;
  MachineBase *this_local;
  
  local_28 = value;
  value_local._2_2_ = address;
  value_local._4_4_ = operation;
  pMStack_18 = this;
  if (address < 0x800) {
    if ((int)operation < 5) {
      *value = this->ram_[address];
    }
    else {
      this->ram_[address] = *value;
    }
  }
  else if (address < 0xc000) {
    if ((address < 0x1800) || (0x180f < address)) {
      if ((0x1bff < address) && (address < 0x1c10)) {
        if ((int)operation < 5) {
          sVar1 = MOS::MOS6522::MOS6522<Commodore::C1540::DriveVIA>::read
                            (&this->drive_VIA_,(uint)address,
                             (void *)CONCAT62(in_register_00000012,address),(size_t)value);
          *local_28 = (uint8_t)sVar1;
        }
        else {
          MOS::MOS6522::MOS6522<Commodore::C1540::DriveVIA>::write
                    (&this->drive_VIA_,(uint)address,(void *)(ulong)*value,(size_t)value);
        }
      }
    }
    else if ((int)operation < 5) {
      sVar1 = MOS::MOS6522::MOS6522<Commodore::C1540::SerialPortVIA>::read
                        (&this->serial_port_VIA_,(uint)address,
                         (void *)CONCAT62(in_register_00000012,address),(size_t)value);
      *local_28 = (uint8_t)sVar1;
    }
    else {
      MOS::MOS6522::MOS6522<Commodore::C1540::SerialPortVIA>::write
                (&this->serial_port_VIA_,(uint)address,(void *)(ulong)*value,(size_t)value);
    }
  }
  else if ((int)operation < 5) {
    *value = this->rom_[(int)(address & 0x3fff)];
  }
  Cycles::Cycles(&local_30,1);
  MOS::MOS6522::MOS6522<Commodore::C1540::SerialPortVIA>::run_for(&this->serial_port_VIA_,local_30);
  Cycles::Cycles(&local_38,1);
  MOS::MOS6522::MOS6522<Commodore::C1540::DriveVIA>::run_for(&this->drive_VIA_,local_38);
  Cycles::Cycles((Cycles *)&this_local,1);
  return (Cycles)(WrappedInt<Cycles>)this_local;
}

Assistant:

Cycles MachineBase::perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
	/*
		Memory map (given that I'm unsure yet on any potential mirroring):

			0x0000-0x07ff	RAM
			0x1800-0x180f	the serial-port VIA
			0x1c00-0x1c0f	the drive VIA
			0xc000-0xffff	ROM
	*/
	if(address < 0x800) {
		if(isReadOperation(operation))
			*value = ram_[address];
		else
			ram_[address] = *value;
	} else if(address >= 0xc000) {
		if(isReadOperation(operation)) {
			*value = rom_[address & 0x3fff];
		}
	} else if(address >= 0x1800 && address <= 0x180f) {
		if(isReadOperation(operation))
			*value = serial_port_VIA_.read(address);
		else
			serial_port_VIA_.write(address, *value);
	} else if(address >= 0x1c00 && address <= 0x1c0f) {
		if(isReadOperation(operation))
			*value = drive_VIA_.read(address);
		else
			drive_VIA_.write(address, *value);
	}

	serial_port_VIA_.run_for(Cycles(1));
	drive_VIA_.run_for(Cycles(1));

	return Cycles(1);
}